

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O3

void testTiledCopyPixels(string *tempDir)

{
  int in_EAX;
  int in_ECX;
  int in_R8D;
  int in_R9D;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing fast pixel copying for tiled files",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  anon_unknown.dwarf_304bb5::writeCopyRead(tempDir,0,0,in_ECX,in_R8D,in_R9D,in_EAX);
  anon_unknown.dwarf_304bb5::writeCopyRead(tempDir,0,0x1d,in_ECX,in_R8D,in_R9D,in_EAX);
  anon_unknown.dwarf_304bb5::writeCopyRead(tempDir,0x11,0,in_ECX,in_R8D,in_R9D,in_EAX);
  anon_unknown.dwarf_304bb5::writeCopyRead(tempDir,0x11,0x1d,in_ECX,in_R8D,in_R9D,in_EAX);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void
testTiledCopyPixels (const std::string& tempDir)
{
    try
    {
        cout << "Testing fast pixel copying for tiled files" << endl;

        const int W  = 171;
        const int H  = 259;
        const int DX = 17;
        const int DY = 29;
        const int YS = 55;

        writeCopyRead (tempDir, W, H, DX, YS, 0, 0);
        writeCopyRead (tempDir, W, H, DX, YS, 0, DY);
        writeCopyRead (tempDir, W, H, DX, YS, DX, 0);
        writeCopyRead (tempDir, W, H, DX, YS, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}